

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matsolve.c
# Opt level: O2

int mat_lu(MATRIX A,MATRIX P)

{
  uint uVar1;
  double *pdVar2;
  double *pdVar3;
  int iVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  long lVar8;
  long lVar9;
  ulong uVar10;
  double *pdVar11;
  long lVar12;
  double dVar13;
  
  uVar1 = *(uint *)((long)A + -4);
  uVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar1) {
    uVar6 = (ulong)uVar1;
  }
  for (; uVar6 != uVar5; uVar5 = uVar5 + 1) {
    *P[uVar5] = (double)(int)uVar5;
  }
  uVar5 = 0;
  lVar9 = 1;
  iVar4 = 0;
  while( true ) {
    if (uVar5 == uVar6) {
      return iVar4;
    }
    dVar13 = 0.0;
    uVar7 = uVar5 & 0xffffffff;
    for (uVar10 = uVar5; uVar1 != uVar10; uVar10 = uVar10 + 1) {
      if (dVar13 < ABS(A[(int)*P[uVar10]][uVar5])) {
        uVar7 = uVar10 & 0xffffffff;
        dVar13 = ABS(A[(int)*P[uVar10]][uVar5]);
      }
    }
    if (uVar5 == uVar7) {
      pdVar11 = P[uVar5];
    }
    else {
      iVar4 = iVar4 + 1;
      pdVar11 = P[uVar5];
      pdVar2 = P[(int)uVar7];
      dVar13 = *pdVar11;
      *pdVar11 = *pdVar2;
      *pdVar2 = (double)(int)dVar13;
    }
    lVar8 = lVar9;
    if ((A[(int)*pdVar11][uVar5] == 0.0) && (!NAN(A[(int)*pdVar11][uVar5]))) break;
    for (; (int)lVar8 < (int)uVar1; lVar8 = lVar8 + 1) {
      pdVar2 = P[lVar8];
      A[(int)*pdVar2][uVar5] = A[(int)*pdVar2][uVar5] / A[(int)*pdVar11][uVar5];
      for (lVar12 = lVar9; (int)lVar12 < (int)uVar1; lVar12 = lVar12 + 1) {
        pdVar3 = A[(int)*pdVar2];
        pdVar3[lVar12] = pdVar3[lVar12] - pdVar3[uVar5] * A[(int)*pdVar11][lVar12];
      }
    }
    uVar5 = uVar5 + 1;
    lVar9 = lVar9 + 1;
  }
  return -1;
}

Assistant:

int mat_lu( MATRIX A, MATRIX P )
{
	int	i, j, k, n;
	int	maxi, tmp;
	double	c, c1;
	int	p;

	n = MatCol(A);

	for (p=0,i=0; i<n; i++)
		{
		P[i][0] = i;
		}

	for (k=0; k<n; k++)
	{
	/*
	* --- partial pivoting ---
	*/
	for (i=k, maxi=k, c=0.0; i<n; i++)
		{
		c1 = fabs( A[(int)P[i][0]][k] );
		if (c1 > c)
			{
			c = c1;
			maxi = i;
			}
		}

	/*
	*	row exchange, update permutation vector
	*/
	if (k != maxi)
		{
		p++;
		tmp = P[k][0];
		P[k][0] = P[maxi][0];
		P[maxi][0] = tmp;
		}

	/*
	*	suspected singular matrix
	*/
	if ( A[(int)P[k][0]][k] == 0.0 )
		return (-1);

	for (i=k+1; i<n; i++)
		{
		/*
		* --- calculate m(i,j) ---
		*/
		A[(int)P[i][0]][k] = A[(int)P[i][0]][k] / A[(int)P[k][0]][k];

		/*
		* --- elimination ---
		*/
		for (j=k+1; j<n; j++)
			{
			A[(int)P[i][0]][j] -= A[(int)P[i][0]][k] * A[(int)P[k][0]][j];
			}
		}
	}

	return (p);
}